

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

Boxed_Value
chaiscript::dispatch::detail::
call_func<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
          (_func_Boxed_Value_Boxed_Value_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
           *sig,_func_Boxed_Value_Boxed_Value_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
                **f,Function_Params *params,Type_Conversions_State *t_conversions)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar2;
  undefined8 local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  BVar2 = call_func<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul,1ul>
                    (&local_20);
  _Var1._M_pi = BVar2.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  *(undefined8 *)sig = local_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sig + 8) = local_18;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)sig;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value
      call_func(Ret (*sig)(Params...), const Callable &f, const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) {
        if constexpr (std::is_same_v<Ret, void>) {
          call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions);
          return Handle_Return<void>::handle();
        } else {
          return Handle_Return<Ret>::handle(call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions));
        }
      }